

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall UnitTests::Assert::Error(Assert *this,string *msg)

{
  TestFailure *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  this_00 = (TestFailure *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_40,(string *)msg);
  std::__cxx11::string::string((string *)&local_60,this->m_file,&local_61);
  TestFailure::TestFailure(this_00,&local_40,&local_60,this->m_line);
  __cxa_throw(this_00,&TestFailure::typeinfo,TestFailure::~TestFailure);
}

Assistant:

[[noreturn]] void Error(const std::string& msg) const { throw TestFailure(msg, m_file, m_line); }